

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall
google::protobuf::io::Printer::ValueImpl<true>::ValueImpl<char_const(&)[25],void>
          (ValueImpl<true> *this,char (*value) [25])

{
  undefined8 *puVar1;
  size_t sVar2;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_40 = &local_30;
  sVar2 = strlen(*value);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,value,*value + sVar2);
  puVar1 = (undefined8 *)
           ((long)&(this->value).
                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                   .
                   super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                   .
                   super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                   .
                   super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                   .
                   super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                   .
                   super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
           + 0x10);
  *(undefined8 **)
   &(this->value).
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> = puVar1
  ;
  if (local_40 == &local_30) {
    *puVar1 = local_30;
    *(undefined8 *)
     ((long)&(this->value).
             super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
             .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
     + 0x18) = uStack_28;
  }
  else {
    *(undefined8 **)
     &(this->value).
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> =
         local_40;
    *(undefined8 *)
     ((long)&(this->value).
             super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
             .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
             super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
     + 0x10) = local_30;
  }
  *(undefined8 *)
   ((long)&(this->value).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> +
   8) = local_38;
  *(__index_type *)
   ((long)&(this->value).
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
           .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_> +
   0x20) = '\0';
  (this->consume_after)._M_dataplus._M_p = (pointer)&(this->consume_after).field_2;
  (this->consume_after)._M_string_length = 0;
  (this->consume_after).field_2._M_local_buf[0] = '\0';
  this->consume_parens_if_empty = false;
  return;
}

Assistant:

ValueImpl(Value&& value)  // NOLINT
      : value(ToStringOrCallback(std::forward<Value>(value), Rank2{})) {
    if (std::holds_alternative<Callback>(this->value)) {
      consume_after = ";,";
    }
  }